

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

bool __thiscall
mapbox::detail::Earcut<unsigned_int>::isEarHashed(Earcut<unsigned_int> *this,Node *ear)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Node *p;
  Node *r;
  bool bVar5;
  int32_t iVar6;
  int32_t iVar7;
  Node *q;
  Node *q_00;
  double dVar8;
  double x_;
  double y_;
  double y__00;
  
  p = ear->prev;
  r = ear->next;
  dVar8 = area(this,p,ear,r);
  if (dVar8 < 0.0) {
    dVar8 = r->x;
    y__00 = r->y;
    dVar1 = ear->x;
    dVar2 = ear->y;
    x_ = dVar8;
    if (dVar1 <= dVar8) {
      x_ = dVar1;
    }
    dVar3 = p->x;
    dVar4 = p->y;
    if (dVar3 <= x_) {
      x_ = dVar3;
    }
    y_ = y__00;
    if (dVar2 <= y__00) {
      y_ = dVar2;
    }
    if (dVar4 <= y_) {
      y_ = dVar4;
    }
    if (dVar8 <= dVar1) {
      dVar8 = dVar1;
    }
    if (dVar8 <= dVar3) {
      dVar8 = dVar3;
    }
    if (y__00 <= dVar2) {
      y__00 = dVar2;
    }
    if (y__00 <= dVar4) {
      y__00 = dVar4;
    }
    iVar6 = zOrder(this,x_,y_);
    iVar7 = zOrder(this,dVar8,y__00);
    q = ear;
    do {
      q = q->nextZ;
      q_00 = ear;
      if ((q == (Node *)0x0) || (iVar7 < q->z)) {
        while( true ) {
          q_00 = q_00->prevZ;
          if (q_00 == (Node *)0x0) {
            return true;
          }
          if (q_00->z < iVar6) break;
          if ((((q_00 != ear->prev) && (q_00 != ear->next)) &&
              (bVar5 = pointInTriangle(this,p->x,p->y,ear->x,ear->y,r->x,r->y,q_00->x,q_00->y),
              bVar5)) && (dVar8 = area(this,q_00->prev,q_00,q_00->next), 0.0 <= dVar8)) {
            return false;
          }
        }
        return true;
      }
    } while (((q == ear->prev) || (q == ear->next)) ||
            ((bVar5 = pointInTriangle(this,p->x,p->y,ear->x,ear->y,r->x,r->y,q->x,q->y), !bVar5 ||
             (dVar8 = area(this,q->prev,q,q->next), dVar8 < 0.0))));
  }
  return false;
}

Assistant:

bool Earcut<N>::isEarHashed(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // triangle bbox; min & max are calculated like this for speed
    const double minTX = std::min<double>(a->x, std::min<double>(b->x, c->x));
    const double minTY = std::min<double>(a->y, std::min<double>(b->y, c->y));
    const double maxTX = std::max<double>(a->x, std::max<double>(b->x, c->x));
    const double maxTY = std::max<double>(a->y, std::max<double>(b->y, c->y));

    // z-order range for the current triangle bbox;
    const int32_t minZ = zOrder(minTX, minTY);
    const int32_t maxZ = zOrder(maxTX, maxTY);

    // first look for points inside the triangle in increasing z-order
    Node* p = ear->nextZ;

    while (p && p->z <= maxZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->nextZ;
    }

    // then look for points in decreasing z-order
    p = ear->prevZ;

    while (p && p->z >= minZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->prevZ;
    }

    return true;
}